

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.cpp
# Opt level: O1

string * __thiscall poly::pretty_abi_cxx11_(string *__return_storage_ptr__,poly *this)

{
  bool bVar1;
  uint __val;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  undefined8 extraout_RAX;
  uint uVar7;
  ulong uVar8;
  uint __len;
  __string_type s;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar3 = degree(this);
  if (iVar3 == 0) {
    uVar5 = operator[](this,0);
    __val = -uVar5;
    if (0 < (int)uVar5) {
      __val = uVar5;
    }
    __len = 1;
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar7 = (uint)uVar8;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_0010dba4;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_0010dba4;
        }
        if (uVar7 < 10000) goto LAB_0010dba4;
        uVar8 = uVar8 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_0010dba4:
    uVar5 = -((int)uVar5 >> 0x1f);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (__return_storage_ptr__,(ulong)(__len + uVar5),'-');
    if (__return_storage_ptr__->_M_string_length < (ulong)uVar5) {
      pretty_abi_cxx11_();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      _Unwind_Resume(extraout_RAX);
    }
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((__return_storage_ptr__->_M_dataplus)._M_p + uVar5,__len,__val);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    iVar3 = degree(this);
    if (1 < iVar3) {
      do {
        iVar4 = operator[](this,iVar3);
        if (iVar4 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"x^",2);
          poVar6 = (ostream *)std::ostream::operator<<(local_1a8,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," + ",3);
        }
        bVar1 = 2 < iVar3;
        iVar3 = iVar3 + -1;
      } while (bVar1);
    }
    iVar3 = operator[](this,1);
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"x + ",4);
    }
    iVar3 = operator[](this,0);
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"1 + ",4);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,&local_1d8,0,local_1d8._M_string_length - 3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string poly::pretty() const {
    const auto &rthis = *this;
    if (degree() == 0)
        return std::to_string(rthis[0]);

    std::stringstream ss;
    for (int i = degree(); i >= 2; i--)
        if (rthis[i])
            ss << "x^" << i << " + ";
    if (rthis[1])
        ss << "x + ";
    if (rthis[0])
        ss << "1 + ";

    auto s = ss.str();
    return s.substr(0, s.size() - 3);
}